

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::getComponent<tcu::Vector<float,2>>
          (Functions *this,ExprP<tcu::Vector<float,_2>_> *container,int ndx)

{
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg2;
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg3;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  ExprP<int> local_30;
  int local_1c;
  ExprP<tcu::Vector<float,_2>_> *pEStack_18;
  int ndx_local;
  ExprP<tcu::Vector<float,_2>_> *container_local;
  
  local_1c = ndx;
  pEStack_18 = container;
  container_local = (ExprP<tcu::Vector<float,_2>_> *)this;
  constant<int>((BuiltinPrecisionTests *)&local_30,&local_1c);
  arg2 = voidP();
  arg3 = voidP();
  app<deqp::gls::BuiltinPrecisionTests::Functions::GetComponent<tcu::Vector<float,2>>>
            ((BuiltinPrecisionTests *)this,container,&local_30,arg2,arg3);
  ExprP<int>::~ExprP(&local_30);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<typename T::Element> getComponent (const ExprP<T>& container, int ndx)
{
	DE_ASSERT(0 <= ndx && ndx < T::SIZE);
	return app<GetComponent<T> >(container, constant(ndx));
}